

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

int MD5_Final(uchar *md,MD5_CTX *c)

{
  uint uVar1;
  int extraout_EAX;
  uchar bits [8];
  
  Encode(bits,&c->Nl,8);
  uVar1 = c->Nl >> 3 & 0x3f;
  MD5_Update(c,PADDING,(ulong)(((uint)(0x37 < uVar1) << 6 | 0x38) - uVar1));
  MD5_Update(c,bits,8);
  Encode(md,&c->A,0x10);
  c->data[10] = 0;
  c->data[0xb] = 0;
  c->data[0xc] = 0;
  c->data[0xd] = 0;
  c->data[6] = 0;
  c->data[7] = 0;
  c->data[8] = 0;
  c->data[9] = 0;
  c->data[2] = 0;
  c->data[3] = 0;
  c->data[4] = 0;
  c->data[5] = 0;
  c->Nl = 0;
  c->Nh = 0;
  c->data[0] = 0;
  c->data[1] = 0;
  c->A = 0;
  c->B = 0;
  c->C = 0;
  c->D = 0;
  c->data[0xe] = 0;
  c->data[0xf] = 0;
  return extraout_EAX;
}

Assistant:

static void MD5_Final(unsigned char digest[16], /* message digest */
                      struct md5_ctx *context) /* context */
{
  unsigned char bits[8];
  unsigned int count, padLen;

  /* Save number of bits */
  Encode (bits, context->count, 8);

  /* Pad out to 56 mod 64. */
  count = (unsigned int)((context->count[0] >> 3) & 0x3f);
  padLen = (count < 56) ? (56 - count) : (120 - count);
  MD5_Update (context, PADDING, padLen);

  /* Append length (before padding) */
  MD5_Update (context, bits, 8);

  /* Store state in digest */
  Encode (digest, context->state, 16);

  /* Zeroize sensitive information. */
  memset ((void *)context, 0, sizeof (*context));
}